

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

char * strip_absolute_path(bsdtar *bsdtar,char *p)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  if (((*p == '\\') || (*p == '/')) && ((p[1] == '\\' || (p[1] == '/')))) {
    cVar1 = p[2];
    if (((cVar1 == '?') || (cVar1 == '.')) && ((p[3] == '\\' || (p[3] == '/')))) {
      lVar3 = 4;
      if ((((cVar1 == '?') && ((byte)(p[4] | 0x20U) == 0x75)) && ((byte)(p[5] | 0x20U) == 0x6e)) &&
         ((byte)(p[6] | 0x20U) == 99)) {
        lVar3 = 8;
        if (p[7] != '/') {
          lVar3 = (ulong)(p[7] == '\\') * 4 + 4;
        }
      }
      p = p + lVar3;
      if (bsdtar->warned_lead_slash == '\0') {
        lafe_warnc(0,"Removing leading drive letter from member names");
        bsdtar->warned_lead_slash = '\x01';
      }
    }
  }
  bVar2 = *p;
LAB_0010ea10:
  pbVar4 = (byte *)p;
  p = (char *)pbVar4;
  if (0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) goto LAB_0010ea48;
  if (pbVar4[1] != 0x3a) goto LAB_0010ea48;
  pbVar5 = pbVar4 + 2;
  p = (char *)pbVar5;
  if (bsdtar->warned_lead_slash != '\0') goto LAB_0010ea48;
  lafe_warnc(0,"Removing leading drive letter from member names");
  do {
    bsdtar->warned_lead_slash = '\x01';
    p = (char *)pbVar5;
LAB_0010ea48:
    do {
      bVar2 = *p;
      if ((bVar2 != 0x5c) && (bVar2 != 0x2f)) {
        if (pbVar4 == (byte *)p) {
          return (char *)pbVar4;
        }
        goto LAB_0010ea10;
      }
      if (((byte *)p)[1] == 0x2e) {
        pbVar5 = (byte *)p + 2;
        bVar2 = ((byte *)p)[2];
        if ((bVar2 != 0x5c) && (bVar2 != 0x2f)) {
          if (bVar2 == 0x2e) {
            pbVar5 = (byte *)p + 3;
            if ((((byte *)p)[3] == 0x2f) || (((byte *)p)[3] == 0x5c)) goto LAB_0010ea91;
          }
          goto LAB_0010ea8b;
        }
      }
      else {
LAB_0010ea8b:
        pbVar5 = (byte *)p + 1;
      }
LAB_0010ea91:
      p = (char *)pbVar5;
    } while (bsdtar->warned_lead_slash != '\0');
    lafe_warnc(0,"Removing leading \'%c\' from member names",(ulong)(uint)(int)(char)*pbVar4);
  } while( true );
}

Assistant:

static const char*
strip_absolute_path(struct bsdtar *bsdtar, const char *p)
{
	const char *rp;

	/* Remove leading "//./" or "//?/" or "//?/UNC/"
	 * (absolute path prefixes used by Windows API) */
	if ((p[0] == '/' || p[0] == '\\') &&
	    (p[1] == '/' || p[1] == '\\') &&
	    (p[2] == '.' || p[2] == '?') &&
	    (p[3] == '/' || p[3] == '\\'))
	{
		if (p[2] == '?' &&
		    (p[4] == 'U' || p[4] == 'u') &&
		    (p[5] == 'N' || p[5] == 'n') &&
		    (p[6] == 'C' || p[6] == 'c') &&
		    (p[7] == '/' || p[7] == '\\'))
			p += 8;
		else
			p += 4;
		warn_strip_drive_letter(bsdtar);
	}

	/* Remove multiple leading slashes and Windows drive letters. */
	do {
		rp = p;
		if (((p[0] >= 'a' && p[0] <= 'z') ||
		     (p[0] >= 'A' && p[0] <= 'Z')) &&
		    p[1] == ':') {
			p += 2;
			warn_strip_drive_letter(bsdtar);
		}

		/* Remove leading "/../", "/./", "//", etc. */
		while (p[0] == '/' || p[0] == '\\') {
			if (p[1] == '.' &&
			    p[2] == '.' &&
			    (p[3] == '/' || p[3] == '\\')) {
				p += 3; /* Remove "/..", leave "/" for next pass. */
			} else if (p[1] == '.' &&
				   (p[2] == '/' || p[2] == '\\')) {
				p += 2; /* Remove "/.", leave "/" for next pass. */
			} else
				p += 1; /* Remove "/". */
			warn_strip_leading_char(bsdtar, rp);
		}
	} while (rp != p);

	return (p);
}